

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

uchar __thiscall
ClownLZSS::
DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
::Separate::ReadImplementation(Separate *this)

{
  uchar uVar1;
  undefined1 auVar2 [16];
  pos_type pVar3;
  
  auVar2 = std::istream::tellg();
  std::istream::seekg((this->
                      super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>::Separate>
                      ).input,(this->position)._M_off,(this->position)._M_state);
  uVar1 = std::istream::get();
  pVar3 = (pos_type)std::istream::tellg();
  this->position = pVar3;
  std::istream::seekg((this->
                      super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>::Separate>
                      ).input,auVar2._0_8_,auVar2._8_8_);
  return uVar1;
}

Assistant:

unsigned char ReadImplementation()
			{
				const auto previous_position = Base::Tell();
				Base::Seek(position);
				const auto value = Base::ReadImplementation();
				position = Base::Tell();
				Base::Seek(previous_position);
				return value;
			}